

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointOnCurveProjection.h
# Opt level: O2

ParameterPoint *
anurbs::PointOnCurveProjection<2L>::project_to_line
          (ParameterPoint *__return_storage_ptr__,Vector *point,Vector *a,Vector *b,double *t0,
          double *t1)

{
  double dVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  double dVar6;
  double do2ptr;
  Vector dif;
  Vector r;
  Vector o;
  Vector o2pt;
  double local_d0;
  double local_c8;
  double dStack_c0;
  double local_b8;
  double dStack_b0;
  Matrix<double,_1,_2,_1,_1,_2> local_a8;
  undefined1 local_98 [24];
  double local_80;
  double local_68;
  double dStack_60;
  type local_50;
  
  local_98._0_8_ = b;
  local_98._8_8_ = a;
  Eigen::PlainObjectBase<Eigen::Matrix<double,1,2,1,1,2>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,1,2,1,1,2>const,Eigen::Matrix<double,1,2,1,1,2>const>>
            ((PlainObjectBase<Eigen::Matrix<double,1,2,1,1,2>> *)&local_c8,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_1,_2,_1,_1,_2>,_const_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
              *)local_98);
  dVar1 = dStack_c0 * dStack_c0 + local_c8 * local_c8;
  if (1e-14 <= dVar1) {
    local_a8.super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.m_storage.m_data.array[0]
         = (a->super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>).m_storage.m_data.array
           [0];
    local_a8.super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.m_storage.m_data.array[1]
         = (a->super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>).m_storage.m_data.array
           [1];
    local_50.m_lhs = (LhsNested)(1.0 / dVar1);
    Eigen::MatrixBase<Eigen::Matrix<double,1,2,1,1,2>>::operator*
              ((type *)local_98,(MatrixBase<Eigen::Matrix<double,1,2,1,1,2>> *)&local_c8,
               (double *)&local_50);
    Eigen::PlainObjectBase<Eigen::Matrix<double,1,2,1,1,2>>::
    PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,1,2,1,1,2>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,2,1,1,2>const>const>>
              ((PlainObjectBase<Eigen::Matrix<double,1,2,1,1,2>> *)&local_b8,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_1,_2,_1,_1,_2>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>_>
                *)local_98);
    local_98._0_8_ = point;
    local_98._8_8_ = &local_a8;
    Eigen::PlainObjectBase<Eigen::Matrix<double,1,2,1,1,2>>::
    PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,1,2,1,1,2>const,Eigen::Matrix<double,1,2,1,1,2>const>>
              ((PlainObjectBase<Eigen::Matrix<double,1,2,1,1,2>> *)&local_68,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_1,_2,_1,_1,_2>,_const_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
                *)local_98);
    local_d0 = dStack_60 * dStack_b0 + local_68 * local_b8;
    if (0.0 <= local_d0) {
      if (local_d0 <= 1.0) {
        dVar1 = *t0;
        dVar6 = (*t1 - dVar1) * local_d0;
        Eigen::MatrixBase<Eigen::Matrix<double,1,2,1,1,2>>::operator*
                  (&local_50,(MatrixBase<Eigen::Matrix<double,1,2,1,1,2>> *)&local_c8,&local_d0);
        local_98._8_8_ = local_50.m_lhs;
        local_80 = local_50.m_rhs.m_functor.m_other;
        local_98._0_8_ = &local_a8;
        Eigen::PlainObjectBase<Eigen::Matrix<double,1,2,1,1,2>>::
        PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,1,2,1,1,2>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,1,2,1,1,2>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,2,1,1,2>const>const>const>>
                  ((PlainObjectBase<Eigen::Matrix<double,1,2,1,1,2>> *)
                   &__return_storage_ptr__->second,
                   (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_1,_2,_1,_1,_2>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_1,_2,_1,_1,_2>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>_>_>
                    *)local_98);
        __return_storage_ptr__->first = dVar6 + dVar1;
        return __return_storage_ptr__;
      }
      __return_storage_ptr__->first = *t1;
      uVar2 = *(undefined4 *)
               (b->super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>).m_storage.m_data.
               array;
      uVar3 = *(undefined4 *)
               ((long)(b->super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>).m_storage.
                      m_data.array + 4);
      uVar4 = *(undefined4 *)
               ((b->super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>).m_storage.m_data.
                array + 1);
      uVar5 = *(undefined4 *)
               ((long)(b->super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>).m_storage.
                      m_data.array + 0xc);
      goto LAB_001bc5ba;
    }
  }
  __return_storage_ptr__->first = *t0;
  uVar2 = *(undefined4 *)
           (a->super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>).m_storage.m_data.array;
  uVar3 = *(undefined4 *)
           ((long)(a->super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>).m_storage.m_data
                  .array + 4);
  uVar4 = *(undefined4 *)
           ((a->super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>).m_storage.m_data.array
           + 1);
  uVar5 = *(undefined4 *)
           ((long)(a->super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>).m_storage.m_data
                  .array + 0xc);
LAB_001bc5ba:
  *(undefined4 *)
   (__return_storage_ptr__->second).super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.
   m_storage.m_data.array = uVar2;
  *(undefined4 *)
   ((long)(__return_storage_ptr__->second).
          super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.m_storage.m_data.array + 4) =
       uVar3;
  *(undefined4 *)
   ((__return_storage_ptr__->second).super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.
    m_storage.m_data.array + 1) = uVar4;
  *(undefined4 *)
   ((long)(__return_storage_ptr__->second).
          super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.m_storage.m_data.array + 0xc)
       = uVar5;
  return __return_storage_ptr__;
}

Assistant:

static ParameterPoint project_to_line(const Vector& point, const Vector& a, const Vector& b, const double& t0, const double& t1)
    {
        const Vector dif = b - a;
        const double l = squared_norm(dif);

        if (l < 1e-14) {
            return {t0, a};
        }

        const Vector o = a;
        const Vector r = dif * (1.0 / l);
        const Vector o2pt = point - o;
        const double do2ptr = dot(o2pt, r);

        if (do2ptr < 0) {
            return {t0, a};
        }

        if (do2ptr > 1) {
            return {t1, b};
        }

        const double t = t0 + (t1 - t0) * do2ptr;
        const Vector closest_point = o + dif * do2ptr;

        return {t, closest_point};
    }